

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter.cpp
# Opt level: O3

QBlittable * __thiscall QBlittablePlatformPixmap::blittable(QBlittablePlatformPixmap *this)

{
  QBlittable *pQVar1;
  int iVar2;
  QBlittable *pQVar3;
  undefined4 extraout_var;
  QBlittablePlatformPixmap *that;
  long in_FS_OFFSET;
  undefined8 local_18;
  long local_10;
  QBlittable *pQVar4;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->m_blittable).d;
  if (pQVar3 == (QBlittable *)0x0) {
    local_18._0_4_ = (this->super_QPlatformPixmap).w;
    local_18._4_4_ = (this->super_QPlatformPixmap).h;
    iVar2 = (*(this->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x17])
                      (this,&local_18,(ulong)this->m_alpha);
    pQVar4 = (QBlittable *)CONCAT44(extraout_var,iVar2);
    pQVar1 = (this->m_blittable).d;
    pQVar3 = pQVar1;
    if ((pQVar1 != pQVar4) &&
       ((this->m_blittable).d = pQVar4, pQVar3 = pQVar4, pQVar1 != (QBlittable *)0x0)) {
      (*pQVar1->_vptr_QBlittable[1])();
      pQVar3 = (this->m_blittable).d;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QBlittable *QBlittablePlatformPixmap::blittable() const
{
    if (!m_blittable) {
        QBlittablePlatformPixmap *that = const_cast<QBlittablePlatformPixmap *>(this);
        that->m_blittable.reset(this->createBlittable(QSize(w, h), m_alpha));
    }

    return m_blittable.data();
}